

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QDockWidget * __thiscall QDockAreaLayoutInfo::apply(QDockAreaLayoutInfo *this,bool animate)

{
  uint uVar1;
  uint uVar2;
  QDockAreaLayoutInfo *this_00;
  int iVar3;
  bool bVar4;
  int iVar5;
  QMainWindowLayout *pQVar6;
  ulong uVar7;
  pointer pQVar8;
  undefined4 extraout_var;
  QWidget *pQVar9;
  QWidget *pQVar10;
  QDockAreaLayoutItem *this_01;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  undefined1 auVar13 [16];
  QWidget *local_60;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = qt_mainwindow_layout(this->mainWindow);
  if (this->tabbed != true) goto LAB_003f984c;
  _local_48 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  bVar4 = updateTabBar(this);
  if (bVar4) {
    uVar7 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))();
  }
  else {
    uVar7 = 0;
  }
  iVar5 = (int)uVar7;
  if (uVar7 >> 0x20 != 0 || iVar5 != 0) {
    iVar3 = (int)(uVar7 >> 0x20);
    switch(this->tabBarShape) {
    case 0:
    case 4:
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._4_4_ = (this->rect).y1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      RStack_3c.m_i = iVar3 + local_48._4_4_ + -1;
      break;
    case 1:
    case 5:
      RStack_3c.m_i = (this->rect).y2.m_i;
      local_48._4_4_ = (RStack_3c.m_i - iVar3) + 1;
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      break;
    case 2:
    case 6:
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._4_4_ = (this->rect).y1.m_i;
      RStack_3c.m_i = (this->rect).y2.m_i;
      local_48._8_4_ = iVar5 + local_48._0_4_ + -1;
      break;
    case 3:
    case 7:
      local_48._4_4_ = (this->rect).y1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      local_48._0_4_ = (local_48._8_4_ - iVar5) + 1;
      RStack_3c.m_i = (this->rect).y2.m_i;
      break;
    default:
      goto switchD_003f97dc_default;
    }
  }
switchD_003f97dc_default:
  QWidgetAnimator::animate
            ((QWidgetAnimator *)&pQVar6->widgetAnimator,&this->tabBar->super_QWidget,
             (QRect *)local_48,animate);
LAB_003f984c:
  if ((this->item_list).d.size == 0) {
    local_60 = (QWidget *)0x0;
  }
  else {
    lVar11 = 0;
    uVar7 = 0;
    local_60 = (QWidget *)0x0;
    do {
      pQVar8 = QList<QDockAreaLayoutItem>::data(&this->item_list);
      if ((*(byte *)((long)&pQVar8->flags + lVar11) & 1) == 0) {
        this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar8->subinfo + lVar11);
        if (this_00 == (QDockAreaLayoutInfo *)0x0) {
          this_01 = (QDockAreaLayoutItem *)((long)&pQVar8->widgetItem + lVar11);
          bVar4 = QDockAreaLayoutItem::skip(this_01);
          if (!bVar4) {
            stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
            local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            _local_48 = itemRect(this,(int)uVar7,false);
            iVar5 = (*this_01->widgetItem->_vptr_QLayoutItem[0xd])();
            pQVar9 = (QWidget *)CONCAT44(extraout_var,iVar5);
            uVar1 = (pQVar9->data->crect).x2.m_i;
            uVar2 = (pQVar9->data->crect).y2.m_i;
            QWidgetAnimator::animate
                      ((QWidgetAnimator *)&pQVar6->widgetAnimator,pQVar9,(QRect *)local_48,animate);
            if (((pQVar9->data->widget_attributes & 0x10000) == 0) &&
               (pQVar9 = QWidget::window(pQVar9), (pQVar9->data->widget_attributes & 0x8000) != 0))
            {
              pQVar9 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
              auVar13._0_4_ = -(uint)(local_48._8_4_.m_i < local_48._0_4_.m_i);
              iVar5 = -(uint)(local_48._12_4_.m_i < local_48._4_4_.m_i);
              auVar13._4_4_ = auVar13._0_4_;
              auVar13._8_4_ = iVar5;
              auVar13._12_4_ = iVar5;
              iVar5 = movmskpd((int)pQVar9,auVar13);
              bVar4 = iVar5 != 0;
              bVar12 = (int)(uVar1 | uVar2) < 0;
              if (bVar12 || !bVar4) {
                if ((bVar4) || (pQVar10 = pQVar9, -1 < (int)(uVar1 | uVar2))) goto LAB_003f999b;
              }
              else {
                QWidget::lower(pQVar9);
                pQVar10 = local_60;
              }
              QDockWidget::visibilityChanged((QDockWidget *)pQVar9,bVar12 || !bVar4);
              local_60 = pQVar10;
            }
          }
        }
        else {
          apply(this_00,animate);
        }
      }
LAB_003f999b:
      uVar7 = uVar7 + 1;
      lVar11 = lVar11 + 0x28;
    } while (uVar7 < (ulong)(this->item_list).d.size);
  }
  if (*this->sep == 1) {
    updateSeparatorWidgets(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDockWidget *)local_60;
}

Assistant:

QDockWidget *QDockAreaLayoutInfo::apply(bool animate)
{
    QWidgetAnimator &widgetAnimator = mainWindowLayout()->widgetAnimator;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QRect tab_rect;
        QSize tbh = tabBarSizeHint();

        if (!tbh.isNull()) {
            switch (tabBarShape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    tab_rect = QRect(rect.left(), rect.top(), rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    tab_rect = QRect(rect.left(), rect.bottom() - tbh.height() + 1,
                                        rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    tab_rect = QRect(rect.right() - tbh.width() + 1, rect.top(),
                                        tbh.width(), rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    tab_rect = QRect(rect.left(), rect.top(),
                                        tbh.width(), rect.height());
                    break;
                default:
                    break;
            }
        }

        widgetAnimator.animate(tabBar, tab_rect, animate);
    }
#endif // QT_CONFIG(tabbar)

    QDockWidget *activated = nullptr;

    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];

        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;

        if (item.subinfo != nullptr) {
            item.subinfo->apply(animate);
            continue;
        }

        if (item.skip())
            continue;

        Q_ASSERT(item.widgetItem);
        QRect r = itemRect(i);
        QWidget *w = item.widgetItem->widget();

        QRect geo = w->geometry();
        widgetAnimator.animate(w, r, animate);
        if (!w->isHidden() && w->window()->isVisible()) {
            QDockWidget *dw = qobject_cast<QDockWidget*>(w);
            if (!r.isValid() && geo.right() >= 0 && geo.bottom() >= 0) {
                dw->lower();
                emit dw->visibilityChanged(false);
            } else if (r.isValid()
                        && (geo.right() < 0 || geo.bottom() < 0)) {
                emit dw->visibilityChanged(true);
                activated = dw;
            }
        }
    }
#if QT_CONFIG(tabbar)
    if (*sep == 1)
        updateSeparatorWidgets();
#endif // QT_CONFIG(tabbar)

    return activated;
}